

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::dumpProgramBinary(CLIntercept *this,cl_program program)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double __x;
  char *pcVar4;
  SConfig *pSVar5;
  cl_icd_dispatch *pcVar6;
  ulong uVar7;
  cl_program in_RSI;
  CLIntercept *in_RDI;
  size_t i_3;
  string outputFileName;
  cl_device_type deviceType;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t *programBinarySizes;
  char **programBinaries;
  cl_device_id *devices;
  size_t numDevices;
  cl_int errorCode;
  char numberString [256];
  string fileName;
  SProgramInfo *programInfo;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  lock_guard<std::mutex> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd08;
  Services_Common *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  string *in_stack_fffffffffffffd28;
  Services_Common *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  cl_int in_stack_fffffffffffffd3c;
  ulong local_230;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  int local_1a4;
  void *local_1a0;
  void *local_198;
  void *local_190;
  size_t local_188;
  int local_17c;
  char local_178 [168];
  size_t size;
  void *pvVar8;
  undefined8 uVar9;
  string *fileName_00;
  CLIntercept *this_00;
  allocator local_71;
  string local_70 [32];
  string local_50 [48];
  mapped_type *local_20;
  cl_program local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffcf0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  local_20 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[]((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
                           *)in_stack_fffffffffffffd30,(key_type *)in_stack_fffffffffffffd28);
  std::__cxx11::string::string(local_50);
  OS(in_RDI);
  pcVar4 = sc_DumpDirectoryName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar4,&local_71);
  ::OS::Services_Common::GetDumpDirectoryName
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (string *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  fileName_00 = (string *)0x0;
  this_00 = (CLIntercept *)0x0;
  pvVar8 = (void *)0x0;
  uVar9 = 0;
  local_178[0xa0] = '\0';
  local_178[0xa1] = '\0';
  local_178[0xa2] = '\0';
  local_178[0xa3] = '\0';
  local_178[0xa4] = '\0';
  local_178[0xa5] = '\0';
  local_178[0xa6] = '\0';
  local_178[0xa7] = '\0';
  size = 0;
  local_178[0x90] = '\0';
  local_178[0x91] = '\0';
  local_178[0x92] = '\0';
  local_178[0x93] = '\0';
  local_178[0x94] = '\0';
  local_178[0x95] = '\0';
  local_178[0x96] = '\0';
  local_178[0x97] = '\0';
  local_178[0x98] = '\0';
  local_178[0x99] = '\0';
  local_178[0x9a] = '\0';
  local_178[0x9b] = '\0';
  local_178[0x9c] = '\0';
  local_178[0x9d] = '\0';
  local_178[0x9e] = '\0';
  local_178[0x9f] = '\0';
  local_178[0x80] = '\0';
  local_178[0x81] = '\0';
  local_178[0x82] = '\0';
  local_178[0x83] = '\0';
  local_178[0x84] = '\0';
  local_178[0x85] = '\0';
  local_178[0x86] = '\0';
  local_178[0x87] = '\0';
  local_178[0x88] = '\0';
  local_178[0x89] = '\0';
  local_178[0x8a] = '\0';
  local_178[0x8b] = '\0';
  local_178[0x8c] = '\0';
  local_178[0x8d] = '\0';
  local_178[0x8e] = '\0';
  local_178[0x8f] = '\0';
  local_178[0x70] = '\0';
  local_178[0x71] = '\0';
  local_178[0x72] = '\0';
  local_178[0x73] = '\0';
  local_178[0x74] = '\0';
  local_178[0x75] = '\0';
  local_178[0x76] = '\0';
  local_178[0x77] = '\0';
  local_178[0x78] = '\0';
  local_178[0x79] = '\0';
  local_178[0x7a] = '\0';
  local_178[0x7b] = '\0';
  local_178[0x7c] = '\0';
  local_178[0x7d] = '\0';
  local_178[0x7e] = '\0';
  local_178[0x7f] = '\0';
  local_178[0x60] = '\0';
  local_178[0x61] = '\0';
  local_178[0x62] = '\0';
  local_178[99] = '\0';
  local_178[100] = '\0';
  local_178[0x65] = '\0';
  local_178[0x66] = '\0';
  local_178[0x67] = '\0';
  local_178[0x68] = '\0';
  local_178[0x69] = '\0';
  local_178[0x6a] = '\0';
  local_178[0x6b] = '\0';
  local_178[0x6c] = '\0';
  local_178[0x6d] = '\0';
  local_178[0x6e] = '\0';
  local_178[0x6f] = '\0';
  local_178[0x50] = '\0';
  local_178[0x51] = '\0';
  local_178[0x52] = '\0';
  local_178[0x53] = '\0';
  local_178[0x54] = '\0';
  local_178[0x55] = '\0';
  local_178[0x56] = '\0';
  local_178[0x57] = '\0';
  local_178[0x58] = '\0';
  local_178[0x59] = '\0';
  local_178[0x5a] = '\0';
  local_178[0x5b] = '\0';
  local_178[0x5c] = '\0';
  local_178[0x5d] = '\0';
  local_178[0x5e] = '\0';
  local_178[0x5f] = '\0';
  local_178[0x40] = '\0';
  local_178[0x41] = '\0';
  local_178[0x42] = '\0';
  local_178[0x43] = '\0';
  local_178[0x44] = '\0';
  local_178[0x45] = '\0';
  local_178[0x46] = '\0';
  local_178[0x47] = '\0';
  local_178[0x48] = '\0';
  local_178[0x49] = '\0';
  local_178[0x4a] = '\0';
  local_178[0x4b] = '\0';
  local_178[0x4c] = '\0';
  local_178[0x4d] = '\0';
  local_178[0x4e] = '\0';
  local_178[0x4f] = '\0';
  local_178[0x30] = '\0';
  local_178[0x31] = '\0';
  local_178[0x32] = '\0';
  local_178[0x33] = '\0';
  local_178[0x34] = '\0';
  local_178[0x35] = '\0';
  local_178[0x36] = '\0';
  local_178[0x37] = '\0';
  local_178[0x38] = '\0';
  local_178[0x39] = '\0';
  local_178[0x3a] = '\0';
  local_178[0x3b] = '\0';
  local_178[0x3c] = '\0';
  local_178[0x3d] = '\0';
  local_178[0x3e] = '\0';
  local_178[0x3f] = '\0';
  local_178[0x20] = '\0';
  local_178[0x21] = '\0';
  local_178[0x22] = '\0';
  local_178[0x23] = '\0';
  local_178[0x24] = '\0';
  local_178[0x25] = '\0';
  local_178[0x26] = '\0';
  local_178[0x27] = '\0';
  local_178[0x28] = '\0';
  local_178[0x29] = '\0';
  local_178[0x2a] = '\0';
  local_178[0x2b] = '\0';
  local_178[0x2c] = '\0';
  local_178[0x2d] = '\0';
  local_178[0x2e] = '\0';
  local_178[0x2f] = '\0';
  local_178[0x10] = '\0';
  local_178[0x11] = '\0';
  local_178[0x12] = '\0';
  local_178[0x13] = '\0';
  local_178[0x14] = '\0';
  local_178[0x15] = '\0';
  local_178[0x16] = '\0';
  local_178[0x17] = '\0';
  local_178[0x18] = '\0';
  local_178[0x19] = '\0';
  local_178[0x1a] = '\0';
  local_178[0x1b] = '\0';
  local_178[0x1c] = '\0';
  local_178[0x1d] = '\0';
  local_178[0x1e] = '\0';
  local_178[0x1f] = '\0';
  local_178[0] = '\0';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  local_178[8] = '\0';
  local_178[9] = '\0';
  local_178[10] = '\0';
  local_178[0xb] = '\0';
  local_178[0xc] = '\0';
  local_178[0xd] = '\0';
  local_178[0xe] = '\0';
  local_178[0xf] = '\0';
  pSVar5 = config(in_RDI);
  if ((pSVar5->OmitProgramNumber & 1U) == 0) {
    snprintf(local_178,0x100,"%04u_%08X_%04u_%08X",(ulong)local_20->ProgramNumber,
             local_20->ProgramHash & 0xffffffff,(ulong)local_20->CompileCount,
             (int)local_20->OptionsHash);
  }
  else {
    snprintf(local_178,0x100,"%08X_%04u_%08X",local_20->ProgramHash & 0xffffffff,
             (ulong)local_20->CompileCount,local_20->OptionsHash & 0xffffffff);
  }
  std::__cxx11::string::operator+=(local_50,"/CLI_");
  std::__cxx11::string::operator+=(local_50,local_178);
  OS(in_RDI);
  ::OS::Services_Common::MakeDumpDirectories(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_17c = 0;
  local_188 = 0;
  pcVar6 = dispatch(in_RDI);
  local_17c = (*pcVar6->clGetProgramInfo)(local_10,0x1163,0,(void *)0x0,&local_188);
  local_190 = (void *)0x0;
  local_198 = (void *)0x0;
  local_1a0 = (void *)0x0;
  if (local_17c == 0) {
    local_188 = local_188 >> 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_188;
    uVar7 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    local_190 = operator_new__(uVar7);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_188;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    local_198 = operator_new__(uVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_188;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    local_1a0 = operator_new__(uVar7);
    if (((local_190 == (void *)0x0) || (local_198 == (void *)0x0)) || (local_1a0 == (void *)0x0)) {
      local_1a4 = 0;
      std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_1a4);
      local_17c = -6;
    }
  }
  if (local_17c == 0) {
    for (local_1b0 = 0; local_1b0 < local_188; local_1b0 = local_1b0 + 1) {
      *(undefined8 *)((long)local_198 + local_1b0 * 8) = 0;
    }
    pcVar6 = dispatch(in_RDI);
    local_17c = (*pcVar6->clGetProgramInfo)(local_10,0x1163,local_188 << 3,local_190,(size_t *)0x0);
  }
  if (local_17c == 0) {
    pcVar6 = dispatch(in_RDI);
    in_stack_fffffffffffffd3c =
         (*pcVar6->clGetProgramInfo)(local_10,0x1165,local_188 << 3,local_1a0,(size_t *)0x0);
    local_17c = in_stack_fffffffffffffd3c;
  }
  if (local_17c == 0) {
    for (local_1b8 = 0; local_1b8 < local_188; local_1b8 = local_1b8 + 1) {
      in_stack_fffffffffffffd30 =
           (Services_Common *)operator_new__(*(ulong *)((long)local_1a0 + local_1b8 * 8));
      *(Services_Common **)((long)local_198 + local_1b8 * 8) = in_stack_fffffffffffffd30;
      if (*(long *)((long)local_198 + local_1b8 * 8) == 0) {
        local_17c = -6;
        break;
      }
    }
    if (local_17c == 0) {
      pcVar6 = dispatch(in_RDI);
      local_17c = (*pcVar6->clGetProgramInfo)
                            (local_10,0x1166,local_188 << 3,local_198,(size_t *)0x0);
    }
    if (local_17c == 0) {
      for (local_1c0 = 0; local_1c0 < local_188; local_1c0 = local_1c0 + 1) {
        local_1c8 = 1;
        pcVar6 = dispatch(in_RDI);
        (*pcVar6->clGetDeviceInfo)
                  (*(cl_device_id *)((long)local_190 + local_1c0 * 8),0x1000,8,&local_1c8,
                   (size_t *)0x0);
        std::__cxx11::string::string(local_1e8,local_50);
        if ((local_1c8 & 2) != 0) {
          std::__cxx11::string::operator+=(local_1e8,"_CPU");
        }
        if ((local_1c8 & 4) != 0) {
          std::__cxx11::string::operator+=(local_1e8,"_GPU");
        }
        if ((local_1c8 & 8) != 0) {
          std::__cxx11::string::operator+=(local_1e8,"_ACC");
        }
        if ((local_1c8 & 0x10) != 0) {
          std::__cxx11::string::operator+=(local_1e8,"_CUSTOM");
        }
        std::__cxx11::string::operator+=(local_1e8,".bin");
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffd30);
        __x = (double)std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
        log(in_RDI,__x);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_228);
        dumpMemoryToFile(this_00,fileName_00,SUB81((ulong)uVar9 >> 0x38,0),pvVar8,size);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    for (local_230 = 0; local_230 < local_188; local_230 = local_230 + 1) {
      pvVar8 = *(void **)((long)local_198 + local_230 * 8);
      if (pvVar8 != (void *)0x0) {
        operator_delete__(pvVar8);
      }
      *(undefined8 *)((long)local_198 + local_230 * 8) = 0;
    }
  }
  if (local_190 != (void *)0x0) {
    operator_delete__(local_190);
  }
  local_190 = (void *)0x0;
  if (local_198 != (void *)0x0) {
    operator_delete__(local_198);
  }
  local_198 = (void *)0x0;
  if (local_1a0 != (void *)0x0) {
    operator_delete__(local_1a0);
  }
  local_1a0 = (void *)0x0;
  std::__cxx11::string::~string(local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2179f3);
  return;
}

Assistant:

void CLIntercept::dumpProgramBinary(
    const cl_program program )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    std::string     fileName;

    // Get the dump directory name.
    {
        OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
    }
    // Make the file name.  It will have the form:
    //   CLI_<program number>_<program hash>_<compile count>_<options hash>
    // Leave off the extension for now.
    {
        char    numberString[256] = "";

        if( config().OmitProgramNumber )
        {
            CLI_SPRINTF( numberString, 256, "%08X_%04u_%08X",
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }
        else
        {
            CLI_SPRINTF( numberString, 256, "%04u_%08X_%04u_%08X",
                programInfo.ProgramNumber,
                (unsigned int)programInfo.ProgramHash,
                programInfo.CompileCount,
                (unsigned int)programInfo.OptionsHash );
        }

        fileName += "/CLI_";
        fileName += numberString;
    }
    // Now make directories as appropriate.
    {
        OS().MakeDumpDirectories( fileName );
    }

    cl_int  errorCode = CL_SUCCESS;

    size_t  numDevices = 0;

    if( errorCode == CL_SUCCESS )
    {
        // Get all of the devices associated with this program.
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            0,
            NULL,
            &numDevices );
    }

    cl_device_id*   devices = NULL;
    char**          programBinaries = NULL;
    size_t*         programBinarySizes = NULL;

    if( errorCode == CL_SUCCESS )
    {
        numDevices /= sizeof( cl_device_id );

        devices = new cl_device_id[ numDevices ];
        programBinaries = new char*[ numDevices ];
        programBinarySizes = new size_t[ numDevices ];

        if( ( devices == NULL ) ||
            ( programBinaries == NULL ) ||
            ( programBinarySizes == NULL ) )
        {
            CLI_ASSERT( 0 );
            errorCode = CL_OUT_OF_HOST_MEMORY;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[i] = NULL;
        }

        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_DEVICES,
            numDevices * sizeof( cl_device_id ),
            devices,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetProgramInfo(
            program,
            CL_PROGRAM_BINARY_SIZES,
            numDevices * sizeof( size_t ),
            programBinarySizes,
            NULL );
    }

    if( errorCode == CL_SUCCESS )
    {
        for( size_t i = 0; i < numDevices; i++ )
        {
            programBinaries[ i ] = new char[ programBinarySizes[ i ] ];
            if( programBinaries[ i ] == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
                break;
            }
        }

        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clGetProgramInfo(
                program,
                CL_PROGRAM_BINARIES,
                numDevices * sizeof( char* ),
                programBinaries,
                NULL );
        }

        if( errorCode == CL_SUCCESS )
        {
            for( size_t i = 0; i < numDevices; i++ )
            {
                cl_device_type  deviceType = CL_DEVICE_TYPE_DEFAULT;

                // It's OK if this fails.  If it does, it just
                // means that our output file won't have a device
                // type.
                dispatch().clGetDeviceInfo(
                    devices[ i ],
                    CL_DEVICE_TYPE,
                    sizeof( deviceType ),
                    &deviceType,
                    NULL );

                std::string outputFileName = fileName;

                if( deviceType & CL_DEVICE_TYPE_CPU )
                {
                    outputFileName += "_CPU";
                }
                if( deviceType & CL_DEVICE_TYPE_GPU )
                {
                    outputFileName += "_GPU";
                }
                if( deviceType & CL_DEVICE_TYPE_ACCELERATOR )
                {
                    outputFileName += "_ACC";
                }
                if( deviceType & CL_DEVICE_TYPE_CUSTOM )
                {
                    outputFileName += "_CUSTOM";
                }

                outputFileName += ".bin";

                log( "Dumping program binary to file: " + outputFileName + "\n" );
                dumpMemoryToFile(
                    outputFileName,
                    false,
                    programBinaries[ i ],
                    programBinarySizes[ i ] );
            }
        }

        for( size_t i = 0; i < numDevices; i++ )
        {
            delete [] programBinaries[ i ];
            programBinaries[ i ] = NULL;
        }
    }

    delete [] devices;
    devices = NULL;

    delete [] programBinaries;
    programBinaries = NULL;

    delete [] programBinarySizes;
    programBinarySizes = NULL;
}